

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::operator-=(SSVectorBase<double> *this,SSVectorBase<double> *vec)

{
  int iVar1;
  int *piVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  vector<double,_std::allocator<double>_> local_28;
  
  if (vec->setupStatus == true) {
    lVar5 = (long)(vec->super_IdxSet).num;
    if (0 < lVar5) {
      piVar2 = (vec->super_IdxSet).idx;
      pdVar3 = (vec->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar4 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar6 = lVar5 + 1;
      do {
        iVar1 = piVar2[uVar6 - 2];
        pdVar4[iVar1] = pdVar4[iVar1] - pdVar3[iVar1];
        uVar6 = uVar6 - 1;
      } while (1 < uVar6);
    }
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              (&local_28,&(vec->super_VectorBase<double>).val);
    pdVar3 = (this->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar7 = (uint)((ulong)((long)(this->super_VectorBase<double>).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar3) >> 3);
    if ((int)uVar7 < 1) {
      if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0022bb63;
    }
    else {
      uVar6 = 0;
      do {
        pdVar3[uVar6] =
             pdVar3[uVar6] -
             local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar6);
    }
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0022bb63:
  if (this->setupStatus == true) {
    this->setupStatus = false;
    setup(this);
  }
  return this;
}

Assistant:

SSVectorBase<R>& operator-=(const SSVectorBase<S>& vec)
   {
      if(vec.isSetup())
      {
         for(int i = vec.size() - 1; i >= 0; --i)
            VectorBase<R>::val[vec.index(i)] -= vec.value(i);
      }
      else
         VectorBase<R>::operator-=(VectorBase<S>(vec));

      if(isSetup())
      {
         setupStatus = false;
         setup();
      }

      return *this;
   }